

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O2

void pzshape::TPZShapeQuad::Shape2dQuadInternal
               (TPZVec<Fad<double>_> *x,int order,TPZVec<Fad<double>_> *phi,
               int quad_transformation_index)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  TPZVec<Fad<double>_> phi1;
  TPZVec<Fad<double>_> phi0;
  undefined1 local_78 [32];
  TPZVec<Fad<double>_> out;
  double local_38;
  
  if (-1 < order) {
    TPZVec<Fad<double>_>::TPZVec(&out,2);
    TransformPoint2dQ(quad_transformation_index,x,&out);
    uVar1 = order + 1;
    if ((phi->fNElements < (long)(ulong)(uVar1 * uVar1)) || ((phi->fStore->dx_).num_elts < 3)) {
      phi1._vptr_TPZVec = (_func_int **)0x0;
      Fad<double>::Fad((Fad<double> *)&phi0,3,(double *)&phi1);
      (*phi->_vptr_TPZVec[2])(phi,(ulong)(uVar1 * uVar1),&phi0);
      Fad<double>::~Fad((Fad<double> *)&phi0);
    }
    local_78._0_8_ = (Fad<double> *)0x0;
    Fad<double>::Fad((Fad<double> *)&phi1,3,(double *)local_78);
    TPZVec<Fad<double>_>::TPZVec(&phi0,0x14,(Fad<double> *)&phi1);
    Fad<double>::~Fad((Fad<double> *)&phi1);
    local_38 = 0.0;
    Fad<double>::Fad((Fad<double> *)local_78,3,&local_38);
    TPZVec<Fad<double>_>::TPZVec(&phi1,0x14,(Fad<double> *)local_78);
    Fad<double>::~Fad((Fad<double> *)local_78);
    (*(code *)TPZShapeLinear::FADfOrthogonal)(out.fStore,uVar1,&phi0);
    (*(code *)TPZShapeLinear::FADfOrthogonal)(out.fStore + 1,uVar1,&phi1);
    lVar4 = 0;
    for (uVar2 = 0; uVar2 <= (uint)order; uVar2 = uVar2 + 1) {
      for (lVar3 = 0; (ulong)uVar1 * 0x20 != lVar3; lVar3 = lVar3 + 0x20) {
        local_78._0_8_ = phi0.fStore + uVar2;
        local_78._8_8_ = (long)&(phi1.fStore)->val_ + lVar3;
        Fad<double>::operator=
                  ((Fad<double> *)((long)&phi->fStore->val_ + lVar3 + lVar4),
                   (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_78);
      }
      lVar4 = lVar4 + (ulong)uVar1 * 0x20;
    }
    TPZVec<Fad<double>_>::~TPZVec(&phi1);
    TPZVec<Fad<double>_>::~TPZVec(&phi0);
    TPZVec<Fad<double>_>::~TPZVec(&out);
  }
  return;
}

Assistant:

void TPZShapeQuad::Shape2dQuadInternal(TPZVec<FADREAL> &x, int order,
										   TPZVec<FADREAL> &phi,int quad_transformation_index) {
		
		const int ndim = 3;
		if(order < 0) return;
		int ord1 = order+1;
		int numshape = ord1*ord1;
		TPZVec<FADREAL> out(2);
		TransformPoint2dQ(quad_transformation_index,x,out);
		
		if(numshape > phi.NElements()/*Rows()*/ || phi[0].size()/*Cols()*/ < ndim) phi.Resize(numshape, FADREAL(ndim, 0.0));
		//if(dphi.Rows() < 2 || dphi.Cols() < numshape) dphi.Resize(2,numshape);
		//REAL store1[20],store2[20],store3[20],store4[20];
		//TPZFMatrix<REAL> phi0(ord1,1,store1,20),phi1(ord1,1,store2,20),dphi0(1,ord1,store3,20),dphi1(1,ord1,store4,20);
		TPZVec<FADREAL> phi0(20, FADREAL(ndim, 0.0)),
		phi1(20, FADREAL(ndim, 0.0));
		
		TPZShapeLinear::FADfOrthogonal(out[0],ord1,phi0);
		TPZShapeLinear::FADfOrthogonal(out[1],ord1,phi1);
		for (int i=0;i<ord1;i++) {
			for (int j=0;j<ord1;j++) {
				int index = i*ord1+j;
				//phi(index,0) =  phi0(i,0)* phi1(j,0);
				phi[index] =  phi0[i] * phi1[j];
				/*dphi(0,index) = dphi0(0,i)* phi1(j,0);
				 dphi(1,index) =  phi0(i,0)*dphi1(0,j);*/
			}
		}
		//  TransformDerivative2dQ(quad_transformation_index,numshape,phi);
	}